

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall slang::IntervalMapDetails::Path::fillLeft(Path *this,uint32_t targetHeight)

{
  pointer pEVar1;
  uint uVar2;
  uint local_2c;
  NodeRef local_28;
  
  uVar2 = (int)(this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1;
  if (uVar2 < targetHeight) {
    do {
      pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
      local_28.pip.value =
           *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
            ((long)pEVar1[uVar2].node + (ulong)pEVar1[uVar2].offset * 8);
      local_2c = 0;
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
      emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this,&local_28,&local_2c
                );
      uVar2 = (int)(this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len -
              1;
    } while (uVar2 < targetHeight);
  }
  return;
}

Assistant:

[[nodiscard]] constexpr size_type size() const noexcept { return len; }